

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
handle_async_shutdown
          (connection<websocketpp::config::asio_client::transport_config> *this,
          timer_ptr *shutdown_timer,shutdown_handler *callback,error_code *ec)

{
  undefined3 uVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  error_code *peVar5;
  size_t __n;
  error_code eVar6;
  bool local_81;
  undefined4 uStack_6c;
  error_code local_60;
  undefined1 local_50 [8];
  error_code tec;
  error_code local_38;
  error_code *local_28;
  error_code *ec_local;
  shutdown_handler *callback_local;
  timer_ptr *shutdown_timer_local;
  connection<websocketpp::config::asio_client::transport_config> *this_local;
  
  peVar5 = ec;
  local_28 = ec;
  ec_local = (error_code *)callback;
  callback_local = (shutdown_handler *)shutdown_timer;
  shutdown_timer_local = (timer_ptr *)this;
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_38,operation_aborted,(type *)0x0);
  bVar2 = boost::system::operator==(ec,&local_38);
  __n = CONCAT71((int7)((ulong)peVar5 >> 8),bVar2);
  local_81 = true;
  if (!bVar2) {
    peVar3 = std::
             __shared_ptr_access<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)shutdown_timer);
    tec._M_cat = (error_category *)
                 boost::asio::
                 basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ::expires_from_now(peVar3);
    local_81 = lib::asio::is_neg<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_>)tec._M_cat);
  }
  if (local_81 == false) {
    peVar3 = std::
             __shared_ptr_access<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)shutdown_timer);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(peVar3);
    std::error_code::error_code((error_code *)local_50);
    bVar2 = boost::system::error_code::operator_cast_to_bool(local_28);
    peVar5 = local_28;
    if (bVar2) {
      boost::system::error_code::error_code<boost::asio::error::basic_errors>
                (&local_60,not_connected,(type *)0x0);
      bVar2 = boost::system::operator==(peVar5,&local_60);
      if (!bVar2) {
        eVar6 = basic_socket::connection::translate_ec<boost::system::error_code>(*local_28);
        tec._0_8_ = eVar6._M_cat;
        local_50._4_4_ = uStack_6c;
        local_50._0_4_ = eVar6._M_value;
        bVar2 = local_28->failed_;
        uVar1 = *(undefined3 *)&local_28->field_0x5;
        (this->m_tec).val_ = local_28->val_;
        (this->m_tec).failed_ = bVar2;
        *(undefined3 *)&(this->m_tec).field_0x5 = uVar1;
        (this->m_tec).cat_ = local_28->cat_;
        log_err<boost::system::error_code>(this,4,"asio async_shutdown",local_28);
      }
    }
    else {
      peVar4 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_alog);
      bVar2 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                        (peVar4,0x400);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_alog);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (peVar4,0x400,"asio con handle_async_shutdown",__n);
      }
    }
    std::function<void_(const_std::error_code_&)>::operator()(callback,(error_code *)local_50);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_alog);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar4,0x400,"async_shutdown cancelled",__n);
  }
  return;
}

Assistant:

void handle_async_shutdown(timer_ptr shutdown_timer, shutdown_handler
        callback, lib::asio::error_code const & ec)
    {
        if (ec == lib::asio::error::operation_aborted ||
            lib::asio::is_neg(shutdown_timer->expires_from_now()))
        {
            m_alog->write(log::alevel::devel,"async_shutdown cancelled");
            return;
        }

        shutdown_timer->cancel();

        lib::error_code tec;
        if (ec) {
            if (ec == lib::asio::error::not_connected) {
                // The socket was already closed when we tried to close it. This
                // happens periodically (usually if a read or write fails
                // earlier and if it is a real error will be caught at another
                // level of the stack.
            } else {
                // We don't know anything more about this error, give our
                // socket/security policy a crack at it.
                tec = socket_con_type::translate_ec(ec);
                m_tec = ec;

                // all other errors are effectively pass through errors of
				// some sort so print some detail on the info channel for
				// library users to look up if needed.
				log_err(log::elevel::info,"asio async_shutdown",ec);
            }
        } else {
            if (m_alog->static_test(log::alevel::devel)) {
                m_alog->write(log::alevel::devel,
                    "asio con handle_async_shutdown");
            }
        }
        callback(tec);
    }